

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZShapeH1.cpp
# Opt level: O3

void TPZShapeH1<pzshape::TPZShapeCube>::Shape(TPZVec<double> *pt,TPZShapeData *data)

{
  long lVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  ulong uVar5;
  int nod;
  long lVar6;
  int64_t size;
  int d_1;
  long lVar7;
  TPZTransform<double> *this;
  long lVar8;
  int d;
  int side;
  long lVar9;
  TPZFNMatrix<1,_double> auxmat;
  TPZManVector<double,_3> outvec;
  TPZFNMatrix<81,_double> phiblend;
  TPZFNMatrix<81,_double> dphiblend;
  ulong local_16d0;
  long local_16b0;
  TPZFMatrix<double> local_1628;
  double adStack_1598 [2];
  TPZManVector<double,_3> local_1588;
  TPZFMatrix<double> local_1550;
  double adStack_14c0 [101];
  TPZFMatrix<double> local_1198;
  double local_1108 [82];
  TPZFMatrix<double> local_e78;
  double local_de8 [82];
  TPZFMatrix<double> local_b58;
  double adStack_ac8 [101];
  TPZFMatrix<double> local_7a0;
  double adStack_710 [101];
  TPZFMatrix<double> local_3e8;
  double adStack_358 [101];
  
  pzshape::TPZShapeCube::ShapeCorner
            (pt,&(data->fPhi).super_TPZFMatrix<double>,&(data->fDPhi).super_TPZFMatrix<double>);
  if ((data->fPhi).super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow != 8) {
    local_1198.fElem = local_1108;
    local_1198.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 0x1b;
    local_1198.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 1;
    local_1198.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
    local_1198.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
    local_1198.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
         (_func_int **)&PTR__TPZFMatrix_018bbcf0;
    local_1198.fSize = 0x51;
    local_1198.fGiven = local_1198.fElem;
    TPZVec<int>::TPZVec(&local_1198.fPivot.super_TPZVec<int>,0);
    local_1198.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01815498;
    local_1198.fPivot.super_TPZVec<int>.fStore = local_1198.fPivot.fExtAlloc;
    local_1198.fPivot.super_TPZVec<int>.fNElements = 0;
    local_1198.fPivot.super_TPZVec<int>.fNAlloc = 0;
    local_1198.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813df0;
    local_1198.fWork.fStore = (double *)0x0;
    local_1198.fWork.fNElements = 0;
    local_1198.fWork.fNAlloc = 0;
    local_1198.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
         (_func_int **)&PTR__TPZFNMatrix_018bba00;
    local_e78.fElem = local_de8;
    local_e78.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 3;
    local_e78.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 0x1b;
    local_e78.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
    local_e78.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
    local_e78.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
         (_func_int **)&PTR__TPZFMatrix_018bbcf0;
    local_e78.fSize = 0x51;
    local_e78.fGiven = local_e78.fElem;
    TPZVec<int>::TPZVec(&local_e78.fPivot.super_TPZVec<int>,0);
    local_e78.fPivot.super_TPZVec<int>.fStore = local_e78.fPivot.fExtAlloc;
    local_e78.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01815498;
    local_e78.fPivot.super_TPZVec<int>.fNElements = 0;
    local_e78.fPivot.super_TPZVec<int>.fNAlloc = 0;
    local_e78.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813df0;
    local_e78.fWork.fStore = (double *)0x0;
    local_e78.fWork.fNElements = 0;
    local_e78.fWork.fNAlloc = 0;
    local_e78.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
         (_func_int **)&PTR__TPZFNMatrix_018bba00;
    lVar7 = 0;
    lVar6 = 0;
    do {
      if (((data->fPhi).super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <=
           lVar6) ||
         ((data->fPhi).super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1
         )) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      if ((local_1198.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar6) ||
         (local_1198.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      local_1198.fElem[lVar6] = (data->fPhi).super_TPZFMatrix<double>.fElem[lVar6];
      lVar9 = 0;
      do {
        lVar8 = (data->fDPhi).super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.
                fRow;
        if ((lVar8 <= lVar9) ||
           ((data->fDPhi).super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol
            <= lVar6)) {
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        if ((local_e78.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar9) ||
           (local_e78.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol <= lVar6)) {
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        *(undefined8 *)
         ((long)local_e78.fElem +
         lVar9 * 8 + local_e78.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * lVar7) =
             *(undefined8 *)
              ((long)(data->fDPhi).super_TPZFMatrix<double>.fElem + lVar9 * 8 + lVar8 * lVar7);
        lVar9 = lVar9 + 1;
      } while (lVar9 != 3);
      lVar6 = lVar6 + 1;
      lVar7 = lVar7 + 8;
    } while (lVar6 != 8);
    pzshape::TPZShapeCube::ShapeGenerating(pt,&local_1198,&local_e78);
    local_16d0 = 8;
    lVar6 = 8;
    local_16b0 = 0x40;
    do {
      side = (int)lVar6;
      uVar2 = pzshape::TPZShapeCube::NConnectShapeF
                        (side,(data->fH1ConnectOrders).super_TPZVec<int>.fStore[lVar6 + -8]);
      if (uVar2 != 0) {
        if ((local_1198.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar6) ||
           (local_1198.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        lVar7 = (long)(int)local_16d0;
        if ((((int)local_16d0 < 0) ||
            ((data->fPhi).super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow
             <= lVar7)) ||
           ((data->fPhi).super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol <
            1)) {
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        (data->fPhi).super_TPZFMatrix<double>.fElem[lVar7] = local_1198.fElem[lVar6];
        lVar9 = 0;
        do {
          if ((local_e78.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar9) ||
             (local_e78.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol <= lVar6)) {
            TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          lVar8 = (data->fDPhi).super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix
                  .fRow;
          if (((lVar8 <= lVar9) || ((int)local_16d0 < 0)) ||
             ((data->fDPhi).super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.
              fCol <= lVar7)) {
            TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          (data->fDPhi).super_TPZFMatrix<double>.fElem[lVar8 * lVar7 + lVar9] =
               *(double *)
                ((long)local_e78.fElem +
                lVar9 * 8 + local_e78.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * local_16b0)
          ;
          lVar9 = lVar9 + 1;
        } while (lVar9 != 3);
        uVar3 = (int)local_16d0 + 1;
        local_16d0 = (ulong)uVar3;
        if (uVar2 != 1) {
          this = (data->fSideTransforms).super_TPZVec<TPZTransform<double>_>.fStore + lVar6 + -8;
          iVar4 = pztopology::TPZCube::SideDimension(side);
          lVar7 = (long)(int)uVar2;
          local_1550.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 1;
          local_1550.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
          local_1550.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
          local_1550.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
               (_func_int **)&PTR__TPZFMatrix_018379e0;
          local_1550.fSize = 100;
          local_1550.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = lVar7;
          local_1550.fElem = adStack_14c0;
          local_1550.fGiven = adStack_14c0;
          TPZVec<int>::TPZVec(&local_1550.fPivot.super_TPZVec<int>,0);
          local_1550.fPivot.super_TPZVec<int>._vptr_TPZVec =
               (_func_int **)&PTR__TPZManVector_01815498;
          local_1550.fPivot.super_TPZVec<int>.fStore = local_1550.fPivot.fExtAlloc;
          local_1550.fPivot.super_TPZVec<int>.fNElements = 0;
          local_1550.fPivot.super_TPZVec<int>.fNAlloc = 0;
          local_1550.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813df0;
          local_1550.fWork.fStore = (double *)0x0;
          local_1550.fWork.fNElements = 0;
          local_1550.fWork.fNAlloc = 0;
          if (100 < (int)uVar2) {
            local_1550.fElem = (double *)operator_new__(lVar7 * 8);
          }
          local_1550.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
               (_func_int **)&PTR__TPZFNMatrix_018376f0;
          lVar9 = (long)iVar4;
          local_b58.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
          local_b58.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
          local_b58.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
               (_func_int **)&PTR__TPZFMatrix_018379e0;
          local_b58.fSize = 100;
          local_b58.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = lVar9;
          local_b58.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = lVar7;
          local_b58.fElem = adStack_ac8;
          local_b58.fGiven = adStack_ac8;
          TPZVec<int>::TPZVec(&local_b58.fPivot.super_TPZVec<int>,0);
          local_b58.fPivot.super_TPZVec<int>._vptr_TPZVec =
               (_func_int **)&PTR__TPZManVector_01815498;
          local_b58.fPivot.super_TPZVec<int>.fStore = local_b58.fPivot.fExtAlloc;
          local_b58.fPivot.super_TPZVec<int>.fNElements = 0;
          local_b58.fPivot.super_TPZVec<int>.fNAlloc = 0;
          local_b58.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813df0;
          local_b58.fWork.fStore = (double *)0x0;
          local_b58.fWork.fNElements = 0;
          local_b58.fWork.fNAlloc = 0;
          if (iVar4 == 0) {
            local_b58.fElem = (double *)0x0;
          }
          else {
            uVar5 = lVar9 * lVar7;
            if (100 < (long)uVar5) {
              local_b58.fElem = (double *)operator_new__(-(ulong)(uVar5 >> 0x3d != 0) | uVar5 * 8);
            }
          }
          local_b58.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
               (_func_int **)&PTR__TPZFNMatrix_018376f0;
          local_7a0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 3;
          local_7a0.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
          local_7a0.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
          local_7a0.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
               (_func_int **)&PTR__TPZFMatrix_018379e0;
          local_7a0.fSize = 100;
          local_7a0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = lVar7;
          local_7a0.fElem = adStack_710;
          local_7a0.fGiven = adStack_710;
          TPZVec<int>::TPZVec(&local_7a0.fPivot.super_TPZVec<int>,0);
          local_7a0.fPivot.super_TPZVec<int>._vptr_TPZVec =
               (_func_int **)&PTR__TPZManVector_01815498;
          local_7a0.fPivot.super_TPZVec<int>.fStore = local_7a0.fPivot.fExtAlloc;
          local_7a0.fPivot.super_TPZVec<int>.fNElements = 0;
          local_7a0.fPivot.super_TPZVec<int>.fNAlloc = 0;
          local_7a0.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813df0;
          local_7a0.fWork.fStore = (double *)0x0;
          local_7a0.fWork.fNElements = 0;
          local_7a0.fWork.fNAlloc = 0;
          if (0x21 < (int)uVar2) {
            local_7a0.fElem = (double *)operator_new__(lVar7 * 0x18);
          }
          local_7a0.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
               (_func_int **)&PTR__TPZFNMatrix_018376f0;
          local_3e8.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 3;
          local_3e8.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
          local_3e8.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
          local_3e8.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
               (_func_int **)&PTR__TPZFMatrix_018379e0;
          local_3e8.fSize = 100;
          local_3e8.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = lVar7;
          local_3e8.fElem = adStack_358;
          local_3e8.fGiven = adStack_358;
          TPZVec<int>::TPZVec(&local_3e8.fPivot.super_TPZVec<int>,0);
          local_3e8.fPivot.super_TPZVec<int>._vptr_TPZVec =
               (_func_int **)&PTR__TPZManVector_01815498;
          local_3e8.fPivot.super_TPZVec<int>.fStore = local_3e8.fPivot.fExtAlloc;
          local_3e8.fPivot.super_TPZVec<int>.fNElements = 0;
          local_3e8.fPivot.super_TPZVec<int>.fNAlloc = 0;
          local_3e8.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813df0;
          local_3e8.fWork.fStore = (double *)0x0;
          local_3e8.fWork.fNElements = 0;
          local_3e8.fWork.fNAlloc = 0;
          if (0x21 < (int)uVar2) {
            local_3e8.fElem = (double *)operator_new__(lVar7 * 0x18);
          }
          local_3e8.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
               (_func_int **)&PTR__TPZFNMatrix_018376f0;
          TPZManVector<double,_3>::TPZManVector(&local_1588,lVar9);
          TPZTransform<double>::Apply(this,pt,&local_1588.super_TPZVec<double>);
          pzshape::TPZShapeCube::ShapeInternal
                    (side,&local_1588.super_TPZVec<double>,
                     (data->fH1ConnectOrders).super_TPZVec<int>.fStore[lVar6 + -8],&local_1550,
                     &local_b58);
          if (iVar4 < 3) {
            local_1628.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 1;
            local_1628.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 1;
            local_1628.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
            local_1628.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
            local_1628.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
                 = (_func_int **)&PTR__TPZFMatrix_018ba970;
            local_1628.fSize = 1;
            local_1628.fElem = adStack_1598;
            local_1628.fGiven = adStack_1598;
            TPZVec<int>::TPZVec(&local_1628.fPivot.super_TPZVec<int>,0);
            local_1628.fPivot.super_TPZVec<int>._vptr_TPZVec =
                 (_func_int **)&PTR__TPZManVector_01815498;
            local_1628.fPivot.super_TPZVec<int>.fStore = local_1628.fPivot.fExtAlloc;
            local_1628.fPivot.super_TPZVec<int>.fNElements = 0;
            local_1628.fPivot.super_TPZVec<int>.fNAlloc = 0;
            local_1628.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813df0;
            local_1628.fWork.fStore = (double *)0x0;
            local_1628.fWork.fNElements = 0;
            local_1628.fWork.fNAlloc = 0;
            local_1628.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
                 = (_func_int **)&PTR__TPZFNMatrix_018ba680;
            TPZFMatrix<double>::operator=(&local_1628,0.0);
            (*(this->fMult).super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.
              super_TPZSavable._vptr_TPZSavable[0x27])
                      (0x3ff0000000000000,0,&this->fMult,&local_b58,&local_1628,&local_7a0,1);
            if (1 < (int)uVar2) {
              local_16d0 = (ulong)(int)uVar3;
              lVar7 = local_16d0 * 8;
              uVar5 = 1;
              lVar9 = 8;
              do {
                if ((local_1198.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar6) ||
                   (local_1198.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
                  TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                  pzinternal::DebugStopImpl
                            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                             ,0x26d);
                }
                if ((local_1550.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= (long)uVar5) ||
                   (local_1550.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
                  TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                  pzinternal::DebugStopImpl
                            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                             ,0x26d);
                }
                if ((((long)local_16d0 < 0) ||
                    ((data->fPhi).super_TPZFMatrix<double>.super_TPZMatrix<double>.
                     super_TPZBaseMatrix.fRow <= (long)local_16d0)) ||
                   ((data->fPhi).super_TPZFMatrix<double>.super_TPZMatrix<double>.
                    super_TPZBaseMatrix.fCol < 1)) {
                  TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                  pzinternal::DebugStopImpl
                            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                             ,0x26d);
                }
                (data->fPhi).super_TPZFMatrix<double>.fElem[local_16d0] =
                     local_1198.fElem[lVar6] * local_1550.fElem[uVar5];
                lVar8 = 0;
                do {
                  if ((local_e78.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar8) ||
                     (local_e78.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol <= lVar6)) {
                    TPZFMatrix<double>::Error
                              ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                    pzinternal::DebugStopImpl
                              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                               ,0x26d);
                  }
                  if ((local_1550.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= (long)uVar5)
                     || (local_1550.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
                    TPZFMatrix<double>::Error
                              ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                    pzinternal::DebugStopImpl
                              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                               ,0x26d);
                  }
                  if ((local_1198.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar6) ||
                     (local_1198.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
                    TPZFMatrix<double>::Error
                              ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                    pzinternal::DebugStopImpl
                              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                               ,0x26d);
                  }
                  if ((local_7a0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar8) ||
                     (local_7a0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol <= (long)uVar5)) {
                    TPZFMatrix<double>::Error
                              ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                    pzinternal::DebugStopImpl
                              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                               ,0x26d);
                  }
                  lVar1 = (data->fDPhi).super_TPZFMatrix<double>.super_TPZMatrix<double>.
                          super_TPZBaseMatrix.fRow;
                  if (((lVar1 <= lVar8) || ((long)local_16d0 < 0)) ||
                     ((data->fDPhi).super_TPZFMatrix<double>.super_TPZMatrix<double>.
                      super_TPZBaseMatrix.fCol <= (long)local_16d0)) {
                    TPZFMatrix<double>::Error
                              ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                    pzinternal::DebugStopImpl
                              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                               ,0x26d);
                  }
                  *(double *)
                   ((long)(data->fDPhi).super_TPZFMatrix<double>.fElem + lVar8 * 8 + lVar1 * lVar7)
                       = *(double *)
                          ((long)local_e78.fElem +
                          lVar8 * 8 +
                          local_e78.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * local_16b0) *
                         local_1550.fElem[uVar5] +
                         local_1198.fElem[lVar6] *
                         *(double *)
                          ((long)local_7a0.fElem +
                          lVar8 * 8 +
                          local_7a0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * lVar9);
                  lVar8 = lVar8 + 1;
                } while (lVar8 != 3);
                local_16d0 = local_16d0 + 1;
                uVar5 = uVar5 + 1;
                lVar7 = lVar7 + 8;
                lVar9 = lVar9 + 8;
              } while (uVar5 != uVar2);
            }
            TPZFMatrix<double>::~TPZFMatrix(&local_1628,&PTR_PTR_018ba938);
          }
          else if (1 < (int)uVar2) {
            local_16d0 = (ulong)(int)uVar3;
            lVar7 = local_16d0 * 8;
            uVar5 = 1;
            lVar9 = 8;
            do {
              if ((local_1198.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar6) ||
                 (local_1198.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
                TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                pzinternal::DebugStopImpl
                          ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                           ,0x26d);
              }
              if ((local_1550.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= (long)uVar5) ||
                 (local_1550.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
                TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                pzinternal::DebugStopImpl
                          ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                           ,0x26d);
              }
              if ((((long)local_16d0 < 0) ||
                  ((data->fPhi).super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix
                   .fRow <= (long)local_16d0)) ||
                 ((data->fPhi).super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.
                  fCol < 1)) {
                TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                pzinternal::DebugStopImpl
                          ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                           ,0x26d);
              }
              (data->fPhi).super_TPZFMatrix<double>.fElem[local_16d0] =
                   local_1198.fElem[lVar6] * local_1550.fElem[uVar5];
              lVar8 = 0;
              do {
                if ((local_e78.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar8) ||
                   (local_e78.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol <= lVar6)) {
                  TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                  pzinternal::DebugStopImpl
                            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                             ,0x26d);
                }
                if ((local_1550.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= (long)uVar5) ||
                   (local_1550.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
                  TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                  pzinternal::DebugStopImpl
                            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                             ,0x26d);
                }
                if ((local_1198.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar6) ||
                   (local_1198.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
                  TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                  pzinternal::DebugStopImpl
                            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                             ,0x26d);
                }
                if ((local_b58.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar8) ||
                   (local_b58.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol <= (long)uVar5)) {
                  TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                  pzinternal::DebugStopImpl
                            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                             ,0x26d);
                }
                lVar1 = (data->fDPhi).super_TPZFMatrix<double>.super_TPZMatrix<double>.
                        super_TPZBaseMatrix.fRow;
                if (((lVar1 <= lVar8) || ((long)local_16d0 < 0)) ||
                   ((data->fDPhi).super_TPZFMatrix<double>.super_TPZMatrix<double>.
                    super_TPZBaseMatrix.fCol <= (long)local_16d0)) {
                  TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                  pzinternal::DebugStopImpl
                            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                             ,0x26d);
                }
                *(double *)
                 ((long)(data->fDPhi).super_TPZFMatrix<double>.fElem + lVar8 * 8 + lVar1 * lVar7) =
                     *(double *)
                      ((long)local_e78.fElem +
                      lVar8 * 8 +
                      local_e78.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * local_16b0) *
                     local_1550.fElem[uVar5] +
                     local_1198.fElem[lVar6] *
                     *(double *)
                      ((long)local_b58.fElem +
                      lVar8 * 8 + local_b58.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * lVar9
                      );
                lVar8 = lVar8 + 1;
              } while (lVar8 != 3);
              local_16d0 = local_16d0 + 1;
              uVar5 = uVar5 + 1;
              lVar7 = lVar7 + 8;
              lVar9 = lVar9 + 8;
            } while (uVar5 != uVar2);
          }
          TPZManVector<double,_3>::~TPZManVector(&local_1588);
          TPZFMatrix<double>::~TPZFMatrix(&local_3e8,&PTR_PTR_018379a8);
          TPZFMatrix<double>::~TPZFMatrix(&local_7a0,&PTR_PTR_018379a8);
          TPZFMatrix<double>::~TPZFMatrix(&local_b58,&PTR_PTR_018379a8);
          TPZFMatrix<double>::~TPZFMatrix(&local_1550,&PTR_PTR_018379a8);
        }
      }
      lVar6 = lVar6 + 1;
      local_16b0 = local_16b0 + 8;
    } while (lVar6 != 0x1b);
    TPZFMatrix<double>::~TPZFMatrix(&local_e78,&PTR_PTR_018bbcb8);
    TPZFMatrix<double>::~TPZFMatrix(&local_1198,&PTR_PTR_018bbcb8);
  }
  return;
}

Assistant:

void TPZShapeH1<TSHAPE>::Shape(const TPZVec<REAL> &pt, TPZShapeData &data) {

    
//    TPZVec<REAL> &pt = par.pt;
//    TPZFMatrix<REAL> &phi = par.phi;
//    TPZFMatrix<REAL> &dphi = par.dphi;
    
    TSHAPE::ShapeCorner(pt,data.fPhi,data.fDPhi);
    
    if(data.fPhi.Rows() == TSHAPE::NCornerNodes) return;
    
    const int dim = TSHAPE::Dimension;
    const int NSides = TSHAPE::NSides;
    const int NCorners = TSHAPE::NCornerNodes;

    TPZFNMatrix<NSides*dim,REAL> phiblend(NSides,1),dphiblend(dim,NSides);
    for(int nod=0; nod<NCorners; nod++)
    {
        phiblend(nod,0) = data.fPhi(nod,0);
        for(int d=0; d< dim; d++)
        {
            dphiblend(d,nod) = data.fDPhi(d,nod);
        }
    }
    TSHAPE::ShapeGenerating(pt, phiblend, dphiblend);
    int shape = NCorners;
    for (int side = NCorners; side<NSides ; side++)
    {
        int numshape = TSHAPE::NConnectShapeF(side, data.fH1ConnectOrders[side-NCorners]);
        if(numshape == 0) continue;
        
        data.fPhi(shape,0) = phiblend(side,0);
        for(int d=0; d<dim; d++) data.fDPhi(d,shape) = dphiblend(d,side);
        shape++;
        
        if(numshape == 1) continue;
        
        TPZTransform<REAL> &transform = data.fSideTransforms[side - NCorners];
        int sidedim = TSHAPE::SideDimension(side);
        TPZFNMatrix<100,REAL> phin(numshape,1), dphin(sidedim,numshape), dphiaux(TSHAPE::Dimension,numshape),
            dphiaux2(TSHAPE::Dimension,numshape);
        TPZManVector<REAL,3> outvec(sidedim);
        transform.Apply(pt, outvec);
//        dphin.Zero();
        TSHAPE::ShapeInternal(side, outvec,data.fH1ConnectOrders[side - NCorners], phin, dphin);
        if(sidedim < 3)
        {
            constexpr REAL alpha = 1.;
            constexpr REAL beta = 0.;
            constexpr int opt = 1;
            TPZFNMatrix<1,REAL> auxmat(1,1,0);    
            TPZFMatrix<REAL> &mult = transform.Mult();
            mult.MultAdd(dphin, auxmat, dphiaux,alpha,beta,opt);
            
            for (int i = 1; i < numshape; i++) {
                data.fPhi(shape,0) = phiblend(side,0)*phin(i,0);
                for(int xj=0;xj<TSHAPE::Dimension;xj++) {
                    data.fDPhi(xj,shape) = dphiblend(xj,side)*phin(i,0)+phiblend(side,0)*dphiaux(xj,i);
                }
                shape++;
            }
        } else
        {
            for (int i = 1; i < numshape; i++) {
                data.fPhi(shape,0) = phiblend(side,0)*phin(i,0);
                for(int xj=0;xj<TSHAPE::Dimension;xj++) {
                    data.fDPhi(xj,shape) = dphiblend(xj,side)*phin(i,0)+phiblend(side,0)*dphin(xj,i);
                }
                shape++;
            }

        }
    }
    
}